

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

int __thiscall QDataWidgetMapperPrivate::itemCount(QDataWidgetMapperPrivate *this)

{
  long *plVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int local_4c;
  QPersistentModelIndex local_38 [3];
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x88) == 1) {
    plVar1 = *(long **)(in_RDI + 0x78);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
    local_4c = (**(code **)(*plVar1 + 0x78))(plVar1,local_20);
  }
  else {
    plVar1 = *(long **)(in_RDI + 0x78);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
    local_4c = (**(code **)(*plVar1 + 0x80))(plVar1,local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4c;
  }
  __stack_chk_fail();
}

Assistant:

inline int itemCount()
    {
        return orientation == Qt::Horizontal
            ? model->rowCount(rootIndex)
            : model->columnCount(rootIndex);
    }